

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

void __thiscall
FluidSynthMIDIDevice::HandleEvent(FluidSynthMIDIDevice *this,int status,int parm1,int parm2)

{
  uint uVar1;
  uint uVar2;
  _func_int_fluid_synth_t_ptr_int_int_int *p_Var3;
  _func_int_fluid_synth_t_ptr_int_int *p_Var4;
  int channel;
  int command;
  int parm2_local;
  int parm1_local;
  int status_local;
  FluidSynthMIDIDevice *this_local;
  
  uVar1 = status & 0xf0;
  uVar2 = status & 0xf;
  if (uVar1 == 0x80) {
    p_Var4 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_noteoff);
    (*p_Var4)(this->FluidSynth,uVar2,parm1);
  }
  else if (uVar1 == 0x90) {
    p_Var3 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_noteon);
    (*p_Var3)(this->FluidSynth,uVar2,parm1,parm2);
  }
  else if (uVar1 != 0xa0) {
    if (uVar1 == 0xb0) {
      p_Var3 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_cc);
      (*p_Var3)(this->FluidSynth,uVar2,parm1,parm2);
    }
    else if (uVar1 == 0xc0) {
      p_Var4 = ::TReqProc::operator_cast_to_function_pointer
                         ((TReqProc *)&fluid_synth_program_change);
      (*p_Var4)(this->FluidSynth,uVar2,parm1);
    }
    else if (uVar1 == 0xd0) {
      p_Var4 = ::TReqProc::operator_cast_to_function_pointer
                         ((TReqProc *)&fluid_synth_channel_pressure);
      (*p_Var4)(this->FluidSynth,uVar2,parm1);
    }
    else if (uVar1 == 0xe0) {
      p_Var4 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_pitch_bend);
      (*p_Var4)(this->FluidSynth,uVar2,parm1 & 0x7fU | (parm2 & 0x7fU) << 7);
    }
  }
  return;
}

Assistant:

void FluidSynthMIDIDevice::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int channel = status & 0x0F;
	
	switch (command)
	{
	case MIDI_NOTEOFF:
		fluid_synth_noteoff(FluidSynth, channel, parm1);
		break;

	case MIDI_NOTEON:
		fluid_synth_noteon(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_POLYPRESS:
		break;

	case MIDI_CTRLCHANGE:
		fluid_synth_cc(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_PRGMCHANGE:
		fluid_synth_program_change(FluidSynth, channel, parm1);
		break;

	case MIDI_CHANPRESS:
		fluid_synth_channel_pressure(FluidSynth, channel, parm1);
		break;

	case MIDI_PITCHBEND:
		fluid_synth_pitch_bend(FluidSynth, channel, (parm1 & 0x7f) | ((parm2 & 0x7f) << 7));
		break;
	}
}